

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall Assimp::SMDImporter::CreateOutputNodes(SMDImporter *this)

{
  bool bVar1;
  aiNode *paVar2;
  reference pBVar3;
  aiNode *pcOldRoot;
  Bone *bone;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_> *__range1;
  SMDImporter *this_local;
  
  paVar2 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar2);
  this->pScene->mRootNode = paVar2;
  AddBoneChildren(this,this->pScene->mRootNode,0xffffffff);
  __end1 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::begin(&this->asBones)
  ;
  bone = (Bone *)std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::end
                           (&this->asBones);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
                                *)&bone);
    if (!bVar1) break;
    pBVar3 = __gnu_cxx::
             __normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
             ::operator*(&__end1);
    aiMatrix4x4t<float>::Inverse(&pBVar3->mOffsetMatrix);
    __gnu_cxx::
    __normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
    ::operator++(&__end1);
  }
  if (((this->pScene->mFlags & 1) == 0) || (this->pScene->mRootNode->mNumChildren != 1)) {
    strcpy((this->pScene->mRootNode->mName).data,"<SMD_root>");
    (this->pScene->mRootNode->mName).length = 10;
  }
  else {
    paVar2 = this->pScene->mRootNode;
    this->pScene->mRootNode = *paVar2->mChildren;
    *paVar2->mChildren = (aiNode *)0x0;
    if (paVar2 != (aiNode *)0x0) {
      aiNode::~aiNode(paVar2);
      operator_delete(paVar2,0x478);
    }
    this->pScene->mRootNode->mParent = (aiNode *)0x0;
  }
  return;
}

Assistant:

void SMDImporter::CreateOutputNodes() {
    pScene->mRootNode = new aiNode();

    // now add all bones as dummy sub nodes to the graph
    AddBoneChildren(pScene->mRootNode,(uint32_t)-1);
    for (auto &bone : asBones) {
        bone.mOffsetMatrix.Inverse();
    }

    // if we have only one bone we can even remove the root node
    if (pScene->mFlags & AI_SCENE_FLAGS_INCOMPLETE && 1 == pScene->mRootNode->mNumChildren) {
        aiNode* pcOldRoot = pScene->mRootNode;
        pScene->mRootNode = pcOldRoot->mChildren[0];
        pcOldRoot->mChildren[0] = nullptr;
        delete pcOldRoot;

        pScene->mRootNode->mParent = nullptr;
    }
    else
    {
        ::strcpy(pScene->mRootNode->mName.data, "<SMD_root>");
        pScene->mRootNode->mName.length = 10;
    }
}